

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::RedeferFunctionBodies
          (ScriptContext *this,ActiveFunctionSet *pActiveFuncs,uint inactiveThreshold)

{
  code *pcVar1;
  anon_class_24_3_5d441f8e_for_mapper mapper;
  anon_class_16_2_46a5a072_for_mapper mapper_00;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  anon_class_16_2_46a5a072_for_mapper fnRedefer;
  anon_class_24_3_5d441f8e_for_mapper fn;
  ActiveFunctionSet *pAStack_18;
  uint inactiveThreshold_local;
  ActiveFunctionSet *pActiveFuncs_local;
  ScriptContext *this_local;
  
  fn.this._4_4_ = inactiveThreshold;
  pAStack_18 = pActiveFuncs;
  pActiveFuncs_local = (ActiveFunctionSet *)this;
  uVar3 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((uVar3 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x45e,"(!this->IsClosed())","!this->IsClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsScriptContextInNonDebugMode(this);
  if (bVar2) {
    fn.inactiveThreshold = (uint *)&stack0xffffffffffffffe8;
    mapper.pActiveFuncs = (ActiveFunctionSet **)fn.inactiveThreshold;
    mapper.inactiveThreshold = (uint *)((long)&fn.this + 4);
    mapper.this = this;
    fn.pActiveFuncs = (ActiveFunctionSet **)this;
    MapFunction<Js::ScriptContext::RedeferFunctionBodies(BVSparse<Memory::ArenaAllocator>*,unsigned_int)::__0>
              (this,mapper);
    if (pAStack_18 != (ActiveFunctionSet *)0x0) {
      mapper_00.inactiveThreshold = (uint *)((long)&fn.this + 4);
      mapper_00.pActiveFuncs = &stack0xffffffffffffffe8;
      MapFunction<Js::ScriptContext::RedeferFunctionBodies(BVSparse<Memory::ArenaAllocator>*,unsigned_int)::__1>
                (this,mapper_00);
    }
  }
  return;
}

Assistant:

void ScriptContext::RedeferFunctionBodies(ActiveFunctionSet *pActiveFuncs, uint inactiveThreshold)
    {
        Assert(!this->IsClosed());

        if (!this->IsScriptContextInNonDebugMode())
        {
            return;
        }

        // For each active function, collect call counts, update inactive counts, and redefer if appropriate.
        // In the redeferral case, we require 2 passes over the set of FunctionBody's.
        // This is because a function inlined in a non-redeferred function cannot itself be redeferred.
        // So we first need to close over the set of non-redeferrable functions, then go back and redefer
        // the eligible candidates.

        auto fn = [&](FunctionBody *functionBody) {
            bool exec = functionBody->InterpretedSinceCallCountCollection();
            functionBody->CollectInterpretedCounts();
            functionBody->MapEntryPoints([&](int index, FunctionEntryPointInfo *entryPointInfo) {
                if (!entryPointInfo->IsCleanedUp() && entryPointInfo->ExecutedSinceCallCountCollection())
                {
                    exec = true;
                }
                entryPointInfo->CollectCallCounts();
            });
            if (exec)
            {
                functionBody->SetInactiveCount(0);
            }
            else
            {
                functionBody->IncrInactiveCount(inactiveThreshold);
            }

            if (pActiveFuncs)
            {
                Assert(this->GetThreadContext()->DoRedeferFunctionBodies());
                bool doRedefer = functionBody->DoRedeferFunction(inactiveThreshold);
                if (!doRedefer)
                {
                    functionBody->UpdateActiveFunctionSet(pActiveFuncs, nullptr);
                }
            }
        };

        this->MapFunction(fn);

        if (!pActiveFuncs)
        {
            return;
        }

        auto fnRedefer = [&](FunctionBody * functionBody) {
            Assert(pActiveFuncs);
            if (!functionBody->IsActiveFunction(pActiveFuncs))
            {
                Assert(functionBody->DoRedeferFunction(inactiveThreshold));
                functionBody->RedeferFunction();
            }
            else
            {
                functionBody->ResetRedeferralAttributes();
            }
        };

        this->MapFunction(fnRedefer);
    }